

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

void av1_change_config_seq(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,_Bool *is_sb_size_changed)

{
  int *piVar1;
  _Bool _Var2;
  _Bool _Var3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  aom_transfer_characteristics_t aVar9;
  BLOCK_SIZE BVar10;
  int iVar11;
  int64_t iVar12;
  byte bVar13;
  int i;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  int iVar22;
  int64_t *piVar23;
  bool bVar24;
  bool bVar25;
  double display_sample_rate;
  double dVar26;
  double display_sample_rate_4;
  double dVar27;
  
  if ((ppi->seq_params).profile != oxcf->profile) {
    (ppi->seq_params).profile = oxcf->profile;
  }
  (ppi->seq_params).bit_depth = (oxcf->tool_cfg).bit_depth;
  aVar9 = (oxcf->color_cfg).transfer_characteristics;
  (ppi->seq_params).color_primaries = (oxcf->color_cfg).color_primaries;
  (ppi->seq_params).transfer_characteristics = aVar9;
  (ppi->seq_params).matrix_coefficients = (oxcf->color_cfg).matrix_coefficients;
  (ppi->seq_params).monochrome = (oxcf->tool_cfg).enable_monochrome;
  (ppi->seq_params).chroma_sample_position = (oxcf->color_cfg).chroma_sample_position;
  (ppi->seq_params).color_range = (oxcf->color_cfg).color_range;
  _Var2 = (oxcf->dec_model_cfg).timing_info_present;
  (ppi->seq_params).timing_info_present = (uint)_Var2;
  uVar7 = (oxcf->dec_model_cfg).timing_info.time_scale;
  iVar14 = (oxcf->dec_model_cfg).timing_info.equal_picture_interval;
  uVar8 = (oxcf->dec_model_cfg).timing_info.num_ticks_per_picture;
  (ppi->seq_params).timing_info.num_units_in_display_tick =
       (oxcf->dec_model_cfg).timing_info.num_units_in_display_tick;
  (ppi->seq_params).timing_info.time_scale = uVar7;
  (ppi->seq_params).timing_info.equal_picture_interval = iVar14;
  (ppi->seq_params).timing_info.num_ticks_per_picture = uVar8;
  (ppi->seq_params).display_model_info_present_flag =
       (oxcf->dec_model_cfg).display_model_info_present_flag;
  _Var3 = (oxcf->dec_model_cfg).decoder_model_info_present_flag;
  (ppi->seq_params).decoder_model_info_present_flag = _Var3;
  if (_Var3 == true) {
    (ppi->seq_params).decoder_model_info.num_units_in_decoding_tick =
         (oxcf->dec_model_cfg).num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = true;
    av1_set_aom_dec_model_info(&(ppi->seq_params).decoder_model_info);
    av1_set_dec_model_op_parameters((ppi->seq_params).op_params);
  }
  else if ((_Var2 == false) || (iVar14 == 0)) {
    (ppi->seq_params).op_params[0].initial_display_delay = 10;
  }
  else {
    av1_set_resource_availability_parameters((ppi->seq_params).op_params);
  }
  av1_update_film_grain_parameters_seq(ppi,oxcf);
  BVar4 = (ppi->seq_params).sb_size;
  BVar10 = BVar4;
  if (ppi->seq_params_locked == 0) {
    BVar10 = av1_select_sb_size(oxcf,(oxcf->frm_dim_cfg).width,(oxcf->frm_dim_cfg).height,
                                ppi->number_spatial_layers);
    (ppi->seq_params).sb_size = BVar10;
    (ppi->seq_params).mib_size =
         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar10];
    (ppi->seq_params).mib_size_log2 = (uint)""[BVar10];
    lVar16 = 0;
    do {
      (ppi->seq_params).tier[lVar16] = (oxcf->tier_mask >> ((uint)lVar16 & 0x1f) & 1) != 0;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x20);
  }
  if ((is_sb_size_changed != (_Bool *)0x0) && (BVar4 != BVar10)) {
    *is_sb_size_changed = true;
  }
  if (ppi->seq_params_locked != 0) goto LAB_001a78d6;
  iVar22 = ppi->number_temporal_layers * ppi->number_spatial_layers + -1;
  bVar24 = false;
  iVar14 = 0;
  if (1 < ppi->number_temporal_layers) {
    iVar14 = iVar22;
  }
  if (1 < ppi->number_spatial_layers) {
    iVar14 = iVar22;
  }
  (ppi->seq_params).operating_points_cnt_minus_1 = iVar14;
  if (ppi->use_svc == 0) {
    bVar24 = (ppi->rtc_ref).set_ref_frame_config == 0;
  }
  if ((oxcf->tool_cfg).force_video_mode == true) {
    (ppi->seq_params).still_picture = '\0';
LAB_001a7456:
    (ppi->seq_params).reduced_still_picture_hdr = '\0';
    (ppi->seq_params).force_integer_mv = '\x02';
    (ppi->seq_params).force_screen_content_tools = '\x02';
    uVar15 = (uint)(oxcf->tool_cfg).enable_order_hint;
    (ppi->seq_params).order_hint_info.enable_order_hint = uVar15;
LAB_001a7474:
    bVar25 = false;
    if (((oxcf->tile_cfg).enable_large_scale_tile == false) &&
       (bVar25 = bVar24, (oxcf->tool_cfg).error_resilient_mode == false)) {
      bVar25 = false;
    }
    (ppi->seq_params).frame_id_numbers_present_flag = bVar25;
    uVar18 = -(uint)(uVar15 == 0) | 6;
  }
  else {
    bVar25 = (oxcf->input_cfg).limit == 1;
    (ppi->seq_params).still_picture = bVar25;
    if (!bVar25) goto LAB_001a7456;
    _Var2 = (oxcf->tool_cfg).full_still_picture_hdr;
    (ppi->seq_params).reduced_still_picture_hdr = _Var2 ^ 1;
    (ppi->seq_params).force_screen_content_tools = '\x02';
    (ppi->seq_params).force_integer_mv = '\x02';
    _Var3 = (oxcf->tool_cfg).enable_order_hint;
    uVar15 = (uint)_Var3;
    (ppi->seq_params).order_hint_info.enable_order_hint = (uint)_Var3;
    if (_Var2 != false) goto LAB_001a7474;
    (ppi->seq_params).frame_id_numbers_present_flag = '\0';
    (ppi->seq_params).order_hint_info.enable_order_hint = 0;
    uVar18 = 0xffffffff;
    uVar15 = 0;
  }
  (ppi->seq_params).order_hint_info.order_hint_bits_minus_1 = uVar18;
  iVar14 = (oxcf->frm_dim_cfg).forced_max_frame_width;
  if (iVar14 == 0) {
    iVar22 = (ppi->seq_params).max_frame_width;
    iVar14 = (oxcf->frm_dim_cfg).width;
    if (iVar14 < iVar22) {
      iVar14 = iVar22;
    }
  }
  (ppi->seq_params).max_frame_width = iVar14;
  iVar22 = (oxcf->frm_dim_cfg).forced_max_frame_height;
  if (iVar22 == 0) {
    iVar22 = (ppi->seq_params).max_frame_height;
    iVar11 = (oxcf->frm_dim_cfg).height;
    if (iVar22 <= iVar11) {
      iVar22 = iVar11;
    }
  }
  else {
    iVar11 = (oxcf->frm_dim_cfg).height;
  }
  uVar18 = 0x1f;
  if (iVar14 - 1U != 0) {
    for (; iVar14 - 1U >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  iVar6 = (uVar18 ^ 0xffffffe0) + 0x21;
  if (iVar14 < 2) {
    iVar6 = 1;
  }
  (ppi->seq_params).max_frame_height = iVar22;
  uVar18 = 0x1f;
  if (iVar22 - 1U != 0) {
    for (; iVar22 - 1U >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  iVar14 = (uVar18 ^ 0xffffffe0) + 0x21;
  if (iVar22 < 2) {
    iVar14 = 1;
  }
  (ppi->seq_params).num_bits_width = iVar6;
  (ppi->seq_params).num_bits_height = iVar14;
  (ppi->seq_params).frame_id_length = 0xf;
  (ppi->seq_params).delta_frame_id_length = 0xe;
  (ppi->seq_params).enable_dual_filter = (oxcf->tool_cfg).enable_dual_filter;
  (ppi->seq_params).order_hint_info.enable_dist_wtd_comp =
       (oxcf->comp_type_cfg).enable_dist_wtd_comp & uVar15;
  (ppi->seq_params).order_hint_info.enable_ref_frame_mvs =
       (oxcf->tool_cfg).ref_frame_mvs_present & uVar15;
  (ppi->seq_params).enable_superres = (oxcf->superres_cfg).enable_superres;
  (ppi->seq_params).enable_cdef = (oxcf->tool_cfg).cdef_control != CDEF_NONE;
  (ppi->seq_params).enable_restoration = (oxcf->tool_cfg).enable_restoration;
  (ppi->seq_params).enable_warped_motion = (oxcf->motion_mode_cfg).enable_warped_motion;
  (ppi->seq_params).enable_interintra_compound = (oxcf->tool_cfg).enable_interintra_comp;
  (ppi->seq_params).enable_masked_compound = (oxcf->comp_type_cfg).enable_masked_comp;
  (ppi->seq_params).enable_intra_edge_filter = (oxcf->intra_mode_cfg).enable_intra_edge_filter;
  (ppi->seq_params).enable_filter_intra = (oxcf->intra_mode_cfg).enable_filter_intra;
  iVar14 = (oxcf->frm_dim_cfg).width;
  dVar26 = (oxcf->input_cfg).init_framerate;
  uVar19 = (long)iVar11 * (long)iVar14;
  if ((long)uVar19 < 0x24001) {
    dVar27 = (double)(long)uVar19 * dVar26;
    if (((0x480 < iVar11) || (0x800 < iVar14)) || (bVar21 = 0, 4423680.0 < dVar27))
    goto LAB_001a7673;
  }
  else if (uVar19 < 0x44101) {
    dVar27 = (double)(long)uVar19 * dVar26;
LAB_001a7673:
    if (((0x630 < iVar11) || (0xb00 < iVar14)) || (bVar21 = 1, 8363520.0 < dVar27))
    goto LAB_001a76a4;
  }
  else if (uVar19 < 0xa2901) {
    dVar27 = (double)(long)uVar19 * dVar26;
LAB_001a76a4:
    if (((0x990 < iVar11) || (0x1100 < iVar14)) || (bVar21 = 4, 19975680.0 < dVar27))
    goto LAB_001a76d5;
  }
  else if (uVar19 < 0x104041) {
    dVar27 = (double)(long)uVar19 * dVar26;
LAB_001a76d5:
    if (((0xc18 < iVar11) || (0x1580 < iVar14)) || (bVar21 = 5, 31950720.0 < dVar27))
    goto LAB_001a7706;
  }
  else if (uVar19 < 0x240001) {
    dVar27 = (double)(long)uVar19 * dVar26;
LAB_001a7706:
    if ((((0xd80 < iVar11) || (0x1800 < iVar14)) || (bVar21 = 8, 70778880.0 < dVar27)) &&
       (((0xd80 < iVar11 || (0x1800 < iVar14)) || (bVar21 = 9, 141557760.0 < dVar27))))
    goto LAB_001a7752;
  }
  else if (uVar19 < 0x880001) {
LAB_001a7752:
    dVar26 = dVar26 * (double)(long)uVar19;
    if (((((0x1100 < iVar11) || (0x2000 < iVar14)) || (bVar21 = 0xc, 267386880.0 < dVar26)) &&
        (((0x1100 < iVar11 || (0x2000 < iVar14)) || (bVar21 = 0xd, 534773760.0 < dVar26)))) &&
       (((0x1100 < iVar11 || (0x2000 < iVar14)) || (bVar21 = 0xe, 1069547520.0 < dVar26))))
    goto LAB_001a77d7;
  }
  else {
    if (uVar19 < 0x2200001) {
      dVar26 = dVar26 * (double)(long)uVar19;
LAB_001a77d7:
      if (((((iVar11 < 0x2201) && (iVar14 < 0x4001)) && (bVar21 = 0x10, dVar26 <= 1069547520.0)) ||
          (((iVar11 < 0x2201 && (iVar14 < 0x4001)) && (bVar21 = 0x11, dVar26 <= 2139095040.0)))) ||
         (((iVar11 < 0x2201 && (iVar14 < 0x4001)) && (bVar21 = 0x12, dVar26 <= 4278190080.0))))
      goto LAB_001a7849;
    }
    bVar21 = 0x1f;
  }
LAB_001a7849:
  piVar23 = &(ppi->seq_params).op_params[0].bitrate;
  lVar16 = 0xc0f9;
  do {
    bVar5 = *(byte *)((long)ppi + lVar16 + -0x6669);
    bVar13 = bVar21;
    if (bVar21 < bVar5) {
      bVar13 = bVar5;
    }
    if (0x1b < bVar5) {
      bVar13 = bVar21;
    }
    *(byte *)((long)ppi->parallel_cpi + lVar16 + -0x20) = bVar13;
    iVar12 = av1_max_level_bitrate
                       ((ppi->seq_params).profile,(uint)bVar13,
                        (uint)*(byte *)((long)ppi->parallel_cpi + lVar16));
    *piVar23 = iVar12;
    if (iVar12 == 0) {
      aom_internal_error(&ppi->error,AOM_CODEC_UNSUP_BITSTREAM,
                         "AV1 does not support this combination of profile, level, and tier.");
      iVar12 = *piVar23;
    }
    piVar23[1] = iVar12;
    lVar16 = lVar16 + 1;
    piVar23 = piVar23 + 6;
  } while (lVar16 != 0xc119);
  av1_set_svc_seq_params(ppi);
LAB_001a78d6:
  piVar1 = &(ppi->seq_params).timing_info_present;
  *piVar1 = *piVar1 & (uint)((ppi->seq_params).reduced_still_picture_hdr == '\0');
  highbd_set_var_fns(ppi);
  lVar16 = (oxcf->rc_cfg).target_bandwidth;
  lVar20 = (oxcf->rc_cfg).optimal_buffer_level_ms;
  lVar17 = (oxcf->rc_cfg).maximum_buffer_size_ms;
  (ppi->p_rc).starting_buffer_level = ((oxcf->rc_cfg).starting_buffer_level_ms * lVar16) / 1000;
  if (lVar20 == 0) {
    lVar20 = lVar16 + 7;
    if (-1 < lVar16) {
      lVar20 = lVar16;
    }
    lVar20 = lVar20 >> 3;
  }
  else {
    lVar20 = (lVar20 * lVar16) / 1000;
  }
  (ppi->p_rc).optimal_buffer_level = lVar20;
  if (lVar17 == 0) {
    lVar20 = lVar16 + 7;
    if (-1 < lVar16) {
      lVar20 = lVar16;
    }
    lVar20 = lVar20 >> 3;
  }
  else {
    lVar20 = (lVar17 * lVar16) / 1000;
  }
  (ppi->p_rc).maximum_buffer_size = lVar20;
  lVar16 = (ppi->p_rc).buffer_level;
  lVar17 = (ppi->p_rc).bits_off_target;
  if (lVar20 <= lVar17) {
    lVar17 = lVar20;
  }
  (ppi->p_rc).bits_off_target = lVar17;
  if (lVar16 < lVar20) {
    lVar20 = lVar16;
  }
  (ppi->p_rc).buffer_level = lVar20;
  return;
}

Assistant:

void av1_change_config_seq(struct AV1_PRIMARY *ppi,
                           const AV1EncoderConfig *oxcf,
                           bool *is_sb_size_changed) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  const DecoderModelCfg *const dec_model_cfg = &oxcf->dec_model_cfg;
  const ColorCfg *const color_cfg = &oxcf->color_cfg;

  if (seq_params->profile != oxcf->profile) seq_params->profile = oxcf->profile;
  seq_params->bit_depth = oxcf->tool_cfg.bit_depth;
  seq_params->color_primaries = color_cfg->color_primaries;
  seq_params->transfer_characteristics = color_cfg->transfer_characteristics;
  seq_params->matrix_coefficients = color_cfg->matrix_coefficients;
  seq_params->monochrome = oxcf->tool_cfg.enable_monochrome;
  seq_params->chroma_sample_position = color_cfg->chroma_sample_position;
  seq_params->color_range = color_cfg->color_range;

  assert(IMPLIES(seq_params->profile <= PROFILE_1,
                 seq_params->bit_depth <= AOM_BITS_10));

  seq_params->timing_info_present = dec_model_cfg->timing_info_present;
  seq_params->timing_info.num_units_in_display_tick =
      dec_model_cfg->timing_info.num_units_in_display_tick;
  seq_params->timing_info.time_scale = dec_model_cfg->timing_info.time_scale;
  seq_params->timing_info.equal_picture_interval =
      dec_model_cfg->timing_info.equal_picture_interval;
  seq_params->timing_info.num_ticks_per_picture =
      dec_model_cfg->timing_info.num_ticks_per_picture;

  seq_params->display_model_info_present_flag =
      dec_model_cfg->display_model_info_present_flag;
  seq_params->decoder_model_info_present_flag =
      dec_model_cfg->decoder_model_info_present_flag;
  if (dec_model_cfg->decoder_model_info_present_flag) {
    // set the decoder model parameters in schedule mode
    seq_params->decoder_model_info.num_units_in_decoding_tick =
        dec_model_cfg->num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = 1;
    av1_set_aom_dec_model_info(&seq_params->decoder_model_info);
    av1_set_dec_model_op_parameters(&seq_params->op_params[0]);
  } else if (seq_params->timing_info_present &&
             seq_params->timing_info.equal_picture_interval &&
             !seq_params->decoder_model_info_present_flag) {
    // set the decoder model parameters in resource availability mode
    av1_set_resource_availability_parameters(&seq_params->op_params[0]);
  } else {
    seq_params->op_params[0].initial_display_delay =
        10;  // Default value (not signaled)
  }

#if !CONFIG_REALTIME_ONLY
  av1_update_film_grain_parameters_seq(ppi, oxcf);
#endif

  int sb_size = seq_params->sb_size;
  // Superblock size should not be updated after the first key frame.
  if (!ppi->seq_params_locked) {
    set_sb_size(seq_params, av1_select_sb_size(oxcf, frm_dim_cfg->width,
                                               frm_dim_cfg->height,
                                               ppi->number_spatial_layers));
    for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i)
      seq_params->tier[i] = (oxcf->tier_mask >> i) & 1;
  }
  if (is_sb_size_changed != NULL && sb_size != seq_params->sb_size)
    *is_sb_size_changed = true;

  // Init sequence level coding tools
  // This should not be called after the first key frame.
  // Note that for SVC encoding the sequence parameters
  // (operating_points_cnt_minus_1, operating_point_idc[],
  // has_nonzero_operating_point_idc) should be updated whenever the
  // number of layers is changed. This is done in the
  // ctrl_set_svc_params().
  if (!ppi->seq_params_locked) {
    seq_params->operating_points_cnt_minus_1 =
        (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1)
            ? ppi->number_spatial_layers * ppi->number_temporal_layers - 1
            : 0;
    init_seq_coding_tools(ppi, oxcf,
                          ppi->use_svc || ppi->rtc_ref.set_ref_frame_config);
  }
  seq_params->timing_info_present &= !seq_params->reduced_still_picture_hdr;

#if CONFIG_AV1_HIGHBITDEPTH
  highbd_set_var_fns(ppi);
#endif

  set_primary_rc_buffer_sizes(oxcf, ppi);
}